

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O3

int __thiscall HttpRequest::buildFirstLine(HttpRequest *this)

{
  string *psVar1;
  URI *this_00;
  char *__s;
  char *pcVar2;
  string *psVar3;
  
  __s = gMethodTypeList[this->mMethod];
  psVar1 = &(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr;
  pcVar2 = (char *)(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)__s);
  std::__cxx11::string::append((char *)psVar1);
  this_00 = &this->mUri;
  psVar3 = URI::getPath_abi_cxx11_(this_00);
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)(psVar3->_M_dataplus)._M_p);
  psVar3 = URI::getQuery_abi_cxx11_(this_00);
  if (psVar3->_M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar1);
    psVar3 = URI::getQuery_abi_cxx11_(this_00);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(psVar3->_M_dataplus)._M_p);
  }
  std::__cxx11::string::append((char *)psVar1);
  return (int)(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr._M_string_length;
}

Assistant:

int HttpRequest::buildFirstLine() const
{
	mHeaderStr = gMethodTypeList[ mMethod ]; 

	mHeaderStr += " ";
	mHeaderStr += mUri.getPath();

	if (not mUri.getQuery().empty())
	{
		mHeaderStr += "?";
		mHeaderStr += mUri.getQuery();
	}

	mHeaderStr += " HTTP/1.1\r\n";

	return mHeaderStr.size();
}